

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_parallel.h
# Opt level: O3

void highwayhash::ThreadPool::RunRange(ThreadPool *self,WorkerCommand command)

{
  atomic<int> *paVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ThreadPool *this;
  int iVar5;
  int local_3c;
  WorkerCommand local_38;
  
  this = self;
  local_38 = command;
  while( true ) {
    iVar5 = (int)(command >> 0x20);
    iVar2 = (iVar5 - ((self->num_reserved_).super___atomic_base<int>._M_i + (int)local_38)) /
            (self->num_threads_ * 2);
    if (iVar2 < 2) {
      iVar2 = 1;
    }
    LOCK();
    paVar1 = &self->num_reserved_;
    iVar4 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + iVar2;
    UNLOCK();
    iVar4 = iVar4 + (int)local_38;
    iVar3 = iVar2 + iVar4;
    if (iVar5 <= iVar2 + iVar4) {
      iVar3 = iVar5;
    }
    if (iVar5 <= iVar4) break;
    do {
      local_3c = iVar4;
      if ((self->task_).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
        if (*(char *)&(this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>
                      ._M_impl.super__Vector_impl_data._M_start == '\x01') {
          std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)this);
        }
        return;
      }
      this = (ThreadPool *)&self->task_;
      (*(self->task_)._M_invoker)((_Any_data *)&self->task_,&local_3c);
      iVar4 = iVar4 + 1;
    } while (iVar4 < iVar3);
  }
  return;
}

Assistant:

static void RunRange(ThreadPool* self, const WorkerCommand command) {
    const int begin = command & 0xFFFFFFFF;
    const int end = command >> 32;
    const int num_tasks = end - begin;

    // OpenMP introduced several "schedule" strategies:
    // "single" (static assignment of exactly one chunk per thread): slower.
    // "dynamic" (allocates k tasks at a time): competitive for well-chosen k.
    // "guided" (allocates k tasks, decreases k): computing k = remaining/n
    //   is faster than halving k each iteration. We prefer this strategy
    //   because it avoids user-specified parameters.

    for (;;) {
      const int num_reserved = self->num_reserved_.load();
      const int num_remaining = num_tasks - num_reserved;
      const int my_size = std::max(num_remaining / (self->num_threads_ * 2), 1);
      const int my_begin = begin + self->num_reserved_.fetch_add(my_size);
      const int my_end = std::min(my_begin + my_size, begin + num_tasks);
      // Another thread already reserved the last task.
      if (my_begin >= my_end) {
        break;
      }
      for (int i = my_begin; i < my_end; ++i) {
        self->task_(i);
      }
    }
  }